

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O3

char * lib_dlb_fgets(char *buf,int len,dlb *dp)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *buf_00;
  
  if (0 < len) {
    if (dp->mark < dp->size) {
      buf_00 = buf;
      if (len != 1) {
        iVar3 = len + -1;
        cVar1 = '\0';
        do {
          if ((dp->size <= dp->mark) || (cVar1 == '\n')) break;
          iVar2 = dlb_fread(buf_00,1,1,dp);
          if (iVar2 < 1) break;
          cVar1 = *buf_00;
          buf_00 = buf_00 + 1;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      *buf_00 = '\0';
    }
    else {
      buf = (char *)0x0;
    }
  }
  return buf;
}

Assistant:

static char *lib_dlb_fgets(char *buf, int len, dlb *dp)
{
    int i;
    char *bp, c = 0;

    if (len <= 0) return buf;	/* sanity check */

    /* return NULL on EOF */
    if (dp->mark >= dp->size) return NULL;

    len--;	/* save room for null */
    for (i = 0, bp = buf;
		i < len && dp->mark < dp->size && c != '\n'; i++, bp++) {
	if (dlb_fread(bp, 1, 1, dp) <= 0) break;	/* EOF or error */
	c = *bp;
    }
    *bp = '\0';

#if defined(WIN32)
    if ((bp = strchr(buf, '\r')) != 0) {
	*bp++ = '\n';
	*bp = '\0';
    }
#endif

    return buf;
}